

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

bool __thiscall glslang::TArraySizes::clearInnerUnsized(TArraySizes *this)

{
  int iVar1;
  uint uVar2;
  undefined4 local_14;
  int d;
  TArraySizes *this_local;
  
  local_14 = 1;
  while( true ) {
    iVar1 = TSmallArrayVector::size(&this->sizes);
    if (iVar1 <= local_14) break;
    uVar2 = TSmallArrayVector::getDimSize(&this->sizes,local_14);
    if (uVar2 == 0) {
      setDimSize(this,local_14,1);
    }
    local_14 = local_14 + 1;
  }
  return false;
}

Assistant:

bool clearInnerUnsized()
    {
        for (int d = 1; d < sizes.size(); ++d) {
            if (sizes.getDimSize(d) == (unsigned)UnsizedArraySize)
                setDimSize(d, 1);
        }

        return false;
    }